

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

float __thiscall deqp::gls::anon_unknown_1::GLValue::toFloat(GLValue *this)

{
  Float<unsigned_int,_8,_23,_127,_3U> FVar1;
  uint uVar2;
  Float<unsigned_short,_5,_10,_15,_3U> local_2;
  
  switch(this->type) {
  case INPUTTYPE_FLOAT:
    return (this->field_1).fl.m_value;
  case INPUTTYPE_FIXED:
    return (float)(*(int *)&this->field_1 * 2 + 1) / 65535.0;
  case INPUTTYPE_DOUBLE:
    return (float)(double)this->field_1;
  case INPUTTYPE_BYTE:
    uVar2 = (uint)(this->field_1).b.m_value;
    break;
  case INPUTTYPE_SHORT:
    uVar2 = (uint)(this->field_1).s.m_value;
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    uVar2 = (uint)(byte)(this->field_1).b.m_value;
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    uVar2 = (uint)(ushort)(this->field_1).s.m_value;
    break;
  case INPUTTYPE_INT:
    return (float)*(int *)&this->field_1;
  case INPUTTYPE_UNSIGNED_INT:
    return (float)(uint)(this->field_1).fl.m_value;
  case INPUTTYPE_HALF:
    FVar1 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_2);
    return (float)FVar1.m_value;
  default:
    return 0.0;
  }
  return (float)(int)uVar2;
}

Assistant:

float GLValue::toFloat (void) const
{
	switch (type)
	{
		case DrawTestSpec::INPUTTYPE_FLOAT:
			return fl.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_BYTE:
			return b.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE:
			return ub.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_SHORT:
			return s.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT:
			return us.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_FIXED:
		{
			int maxValue = 65536;
			return (float)(double(2 * fi.getValue() + 1) / (maxValue - 1));

			break;
		}

		case DrawTestSpec::INPUTTYPE_UNSIGNED_INT:
			return (float)ui.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_INT:
			return (float)i.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_HALF:
			return h.to<float>();
			break;

		case DrawTestSpec::INPUTTYPE_DOUBLE:
			return d.to<float>();
			break;

		default:
			DE_ASSERT(false);
			return 0.0f;
			break;
	};
}